

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SimpleAssignmentPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimpleAssignmentPatternSyntax,slang::syntax::SimpleAssignmentPatternSyntax_const&>
          (BumpAllocator *this,SimpleAssignmentPatternSyntax *args)

{
  SimpleAssignmentPatternSyntax *pSVar1;
  SimpleAssignmentPatternSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pSVar1 = (SimpleAssignmentPatternSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::SimpleAssignmentPatternSyntax::SimpleAssignmentPatternSyntax(in_RSI,pSVar1);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }